

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

unsigned_short ndiGetBX2PortStatus(ndicapi *pol,int portHandle)

{
  uint local_20;
  int n;
  int i;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_20 = 0;
  while (((int)local_20 < (int)pol->Bx2HandleCount &&
         ((uint)pol->Bx2Handles[(int)local_20] != portHandle))) {
    local_20 = local_20 + 1;
  }
  if (local_20 == pol->Bx2HandleCount) {
    pol_local._6_2_ = 0;
  }
  else {
    pol_local._6_2_ = pol->Bx2HandlesStatus[(int)local_20];
  }
  return pol_local._6_2_;
}

Assistant:

ndicapiExport unsigned short ndiGetBX2PortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->Bx2HandlesStatus[i];
}